

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir_set_output_pixel_subrect(STBIR_RESIZE *resize,int subx,int suby,int subw,int subh)

{
  int subh_local;
  int subw_local;
  int suby_local;
  int subx_local;
  STBIR_RESIZE *resize_local;
  
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;
  if ((((subx < resize->output_w) && (0 < subx + subw)) && (suby < resize->output_h)) &&
     (((0 < suby + subh && (subw != 0)) && (subh != 0)))) {
    resize_local._4_4_ = 1;
  }
  else {
    resize_local._4_4_ = 0;
  }
  return resize_local._4_4_;
}

Assistant:

STBIRDEF int stbir_set_output_pixel_subrect( STBIR_RESIZE * resize, int subx, int suby, int subw, int subh )          // sets input region (full region by default)
{
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;

  // are we inbounds?
  if ( ( subx >= resize->output_w ) || ( ( subx + subw ) <= 0 ) || ( suby >= resize->output_h ) || ( ( suby + subh ) <= 0 ) || ( subw == 0 ) || ( subh == 0 ) )
    return 0;

  return 1;
}